

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxratiotester.h
# Opt level: O0

void __thiscall
soplex::SPxRatioTester<double>::setDelta(SPxRatioTester<double> *this,double newDelta)

{
  element_type *peVar1;
  long in_RDI;
  double in_XMM0_Qa;
  Real RVar2;
  SPxRatioTester<double> *in_stack_ffffffffffffff88;
  
  tolerances(in_stack_ffffffffffffff88);
  peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2eb58e);
  RVar2 = Tolerances::epsilon(peVar1);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2eb5a8);
  if (RVar2 < in_XMM0_Qa) {
    *(double *)(in_RDI + 0x20) = in_XMM0_Qa;
  }
  else {
    tolerances(in_stack_ffffffffffffff88);
    peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2eb5d8);
    RVar2 = Tolerances::epsilon(peVar1);
    *(Real *)(in_RDI + 0x20) = RVar2;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2eb602);
  }
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         delta = this->tolerances()->epsilon();
      else
         delta = newDelta;
   }